

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitileave.hpp
# Opt level: O2

uint64_t bitmanip::detail::duplBits_naive(uint64_t input,size_t out_bits_per_in_bits)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  size_t j;
  size_t sVar6;
  
  if (out_bits_per_in_bits != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = out_bits_per_in_bits;
    auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x40);
    uVar3 = 0;
    lVar5 = 0;
    for (uVar4 = 0;
        uVar4 < (SUB168(auVar2 / auVar1,0) + 1) - (ulong)(SUB168(auVar2 % auVar1,0) == 0);
        uVar4 = uVar4 + 1) {
      for (sVar6 = 0; out_bits_per_in_bits != sVar6; sVar6 = sVar6 + 1) {
        uVar3 = uVar3 | (ulong)((input >> (uVar4 & 0x3f) & 1) != 0) <<
                        ((char)lVar5 + (char)sVar6 & 0x3fU);
      }
      lVar5 = lVar5 + out_bits_per_in_bits;
    }
    return uVar3;
  }
  return 0;
}

Assistant:

[[nodiscard]] constexpr std::uint64_t duplBits_naive(std::uint64_t input, std::size_t out_bits_per_in_bits) noexcept
{
    if (out_bits_per_in_bits == 0) {
        return 0;
    }
    const auto lim = bitmanip::divCeil<std::size_t>(64, out_bits_per_in_bits);

    std::uint64_t result = 0;
    for (std::size_t i = 0, b_out = 0; i < lim; ++i) {
        for (std::size_t j = 0; j < out_bits_per_in_bits; ++j, ++b_out) {
            result |= static_cast<std::uint64_t>((input >> i) & 1) << b_out;
        }
    }

    return result;
}